

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O1

bool __thiscall
duckdb::PlanEnumerator::EnumerateCSGRecursive
          (PlanEnumerator *this,JoinRelationSet *node,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *exclusion_set)

{
  bool bVar1;
  bool bVar2;
  JoinRelationSet *pJVar3;
  __node_base_ptr p_Var4;
  reference pvVar5;
  pointer bindings;
  __hash_code __code;
  pointer puVar6;
  size_type __n;
  vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true> union_sets;
  __alloc_node_gen_t __alloc_node_gen;
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
  all_subset;
  vector<unsigned_long,_true> neighbors;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_exclusion_set;
  vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  local_e8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> local_c8;
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  local_c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_a8;
  JoinRelationSet *local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_a0 = node;
  QueryGraphEdges::GetNeighbors
            ((vector<unsigned_long,_true> *)&local_98,this->query_graph,node,exclusion_set);
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_80,&local_98);
    GetAllNeighborSets((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
                        *)&local_c0,(vector<unsigned_long,_true> *)&local_80);
    if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_e8.
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (reference_wrapper<duckdb::JoinRelationSet> *)0x0;
    local_e8.
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (reference_wrapper<duckdb::JoinRelationSet> *)0x0;
    local_e8.
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (reference_wrapper<duckdb::JoinRelationSet> *)0x0;
    local_a8 = &exclusion_set->_M_h;
    ::std::
    vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ::reserve(&local_e8,
              ((long)local_c0.
                     super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c0.
                     super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    if (local_c0.
        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c0.
        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bindings = local_c0.
                 super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        pJVar3 = JoinRelationSetManager::GetJoinRelation
                           (&this->query_graph_manager->set_manager,bindings);
        pJVar3 = JoinRelationSetManager::Union
                           (&this->query_graph_manager->set_manager,local_a0,pJVar3);
        local_68._M_buckets = (__buckets_ptr)pJVar3;
        p_Var4 = ::std::
                 _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           (&(this->plans)._M_h,(ulong)pJVar3 % (this->plans)._M_h._M_bucket_count,
                            (key_type *)&local_68,(__hash_code)pJVar3);
        if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
          bVar1 = EmitCSG(this,pJVar3);
          if (!bVar1) {
            bVar1 = false;
            goto LAB_00d1f241;
          }
        }
        if (local_e8.
            super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_e8.
            super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_68._M_buckets = (__buckets_ptr)pJVar3;
          ::std::
          vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
          ::_M_realloc_insert<std::reference_wrapper<duckdb::JoinRelationSet>>
                    ((vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
                      *)&local_e8,
                     (iterator)
                     local_e8.
                     super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (reference_wrapper<duckdb::JoinRelationSet> *)&local_68);
        }
        else {
          (local_e8.
           super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_data = pJVar3;
          local_e8.
          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_e8.
               super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          local_68._M_buckets = (__buckets_ptr)pJVar3;
        }
        bindings = bindings + 1;
      } while (bindings !=
               local_c0.
               super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_68._M_buckets = (__buckets_ptr)0x0;
    local_68._M_bucket_count = local_a8->_M_bucket_count;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = local_a8->_M_element_count;
    local_68._M_rehash_policy._M_max_load_factor = (local_a8->_M_rehash_policy)._M_max_load_factor;
    local_68._M_rehash_policy._4_4_ = *(undefined4 *)&(local_a8->_M_rehash_policy).field_0x4;
    local_68._M_rehash_policy._M_next_resize = (local_a8->_M_rehash_policy)._M_next_resize;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_c8._M_h = (__hashtable_alloc *)&local_68;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_68,local_a8,&local_c8);
    if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar6 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_c8._M_h = (__hashtable_alloc *)&local_68;
        ::std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,puVar6,&local_c8);
        puVar6 = puVar6 + 1;
      } while (puVar6 != local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    bVar1 = local_e8.
            super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_e8.
            super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar1) {
      __n = 0;
      do {
        pvVar5 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::operator[]
                           ((vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true> *)
                            &local_e8,__n);
        bVar2 = EnumerateCSGRecursive
                          (this,pvVar5->_M_data,
                           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&local_68);
        if (!bVar2) break;
        __n = __n + 1;
        bVar2 = __n < (ulong)((long)local_e8.
                                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3);
        bVar1 = !bVar2;
      } while (bVar2);
    }
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
LAB_00d1f241:
    if (local_e8.
        super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (reference_wrapper<duckdb::JoinRelationSet> *)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    ::std::
    vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_c0);
  }
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool PlanEnumerator::EnumerateCSGRecursive(JoinRelationSet &node, unordered_set<idx_t> &exclusion_set) {
	// find neighbors of S under the exclusion set
	auto neighbors = query_graph.GetNeighbors(node, exclusion_set);
	if (neighbors.empty()) {
		return true;
	}

	auto all_subset = GetAllNeighborSets(neighbors);
	vector<reference<JoinRelationSet>> union_sets;
	union_sets.reserve(all_subset.size());
	for (const auto &rel_set : all_subset) {
		auto &neighbor = query_graph_manager.set_manager.GetJoinRelation(rel_set);
		// emit the combinations of this node and its neighbors
		auto &new_set = query_graph_manager.set_manager.Union(node, neighbor);
		D_ASSERT(new_set.count > node.count);
		if (plans.find(new_set) != plans.end()) {
			if (!EmitCSG(new_set)) {
				return false;
			}
		}
		union_sets.push_back(new_set);
	}

	unordered_set<idx_t> new_exclusion_set = exclusion_set;
	for (const auto &neighbor : neighbors) {
		new_exclusion_set.insert(neighbor);
	}

	// recursively enumerate the sets
	for (idx_t i = 0; i < union_sets.size(); i++) {
		// updated the set of excluded entries with this neighbor
		if (!EnumerateCSGRecursive(union_sets[i], new_exclusion_set)) {
			return false;
		}
	}
	return true;
}